

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectors.h
# Opt level: O2

Vector<float> * __thiscall Vector<float>::operator=(Vector<float> *this,float *val)

{
  uint uVar1;
  float *pfVar2;
  ulong uVar3;
  ulong uVar4;
  allocator<char> local_31;
  string local_30;
  
  uVar1 = this->num_elts;
  if (uVar1 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,
               "Vector< T >& Vector< T >::operator = (const T& val), unallocated vector",&local_31);
    ::error(&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    pfVar2 = this->ptr_to_data;
    uVar4 = 0;
    uVar3 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar3 = uVar4;
    }
    for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      pfVar2[uVar4] = *val;
    }
  }
  return this;
}

Assistant:

Vector< T >& Vector< T >::operator = (const T& val)
{
  if (num_elts != 0)
    for (int i=0; i<num_elts; ++i)
      ptr_to_data[i] = val;
  else error("Vector< T >& Vector< T >::operator = (const T& val), unallocated vector");

  return *this;
}